

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O0

bool __thiscall TestClass::SyncRetFunc0(TestClass *this)

{
  ulong uVar1;
  SyncRetEventAgent0<TestClass,_bool> *this_00;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  int in_R8D;
  SyncRetEventAgent0<TestClass,_bool> *agent;
  bool result;
  TestClass *this_local;
  
  uVar1 = EventDispatcher::isThreadCurrent();
  if ((uVar1 & 1) == 0) {
    this_00 = (SyncRetEventAgent0<TestClass,_bool> *)
              operator_new(0x30,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                           ,0xe9);
    __n = 0;
    SyncRetEventAgent0<TestClass,_bool>::SyncRetEventAgent0(this_00,this,0x10d180);
    sVar2 = SyncRetEventAgent<bool>::send
                      ((SyncRetEventAgent<bool> *)this_00,(int)this + 8,__buf,__n,in_R8D);
    this_local._7_1_ = (bool)((byte)sVar2 & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SyncRetFunc0()
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result = false;
			SyncRetEventAgent0<TestClass, bool>* agent =
				jh_new SyncRetEventAgent0<TestClass, bool>(this, &TestClass::SyncRetFunc0);
			result = agent->send(&mEventThread);
			LOG_INFO("SyncRet0 result RetVal(%d)", result);
			return result;
		}
		LOG_INFO("Received");
		return true;
	}